

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4ec2e9::BNTest_RandRange_Test::TestBody(BNTest_RandRange_Test *this)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *in_R9;
  pointer *__ptr;
  ScopedTrace gtest_trace_1365;
  UniquePtr<BIGNUM> bn;
  bool seen [6];
  UniquePtr<BIGNUM> six;
  ScopedTrace local_91;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  AssertHelper local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  _Head_base<0UL,_bignum_st_*,_false> local_50;
  uint local_44;
  undefined4 local_40;
  undefined2 local_3c;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> local_38;
  
  local_50._M_head_impl = (bignum_st *)BN_new();
  local_38._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (tuple<bignum_st_*,_bssl::internal::Deleter>)BN_new();
  local_80.data_._0_1_ = (internal)((BIGNUM *)local_50._M_head_impl != (BIGNUM *)0x0);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_50._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&local_80,(AssertionResult *)0x53c60c,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x54d,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
  }
  else {
    local_80.data_._0_1_ =
         (internal)
         ((_Head_base<0UL,_bignum_st_*,_false>)
          local_38._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_bignum_st_*,_false>)0x0);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((_Head_base<0UL,_bignum_st_*,_false>)
        local_38._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(internal *)&local_80,(AssertionResult *)"six","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x54e,local_70._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    }
    else {
      iVar1 = BN_set_word((BIGNUM *)
                          local_38._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,6);
      local_80.data_._0_1_ = (internal)(iVar1 != 0);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_80.data_._0_1_) {
        local_40 = 0;
        local_3c = 0;
        local_44 = 0;
        do {
          testing::ScopedTrace::ScopedTrace<unsigned_int>
                    (&local_91,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x555,&local_44);
          iVar1 = BN_rand_range_ex(local_50._M_head_impl,1,
                                   (BIGNUM *)
                                   local_38._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
          local_80.data_._0_1_ = (internal)(iVar1 != 0);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_70,(internal *)&local_80,
                       (AssertionResult *)"BN_rand_range_ex(bn.get(), 1, six.get())","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x556,local_70._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_90._M_head_impl + 8))();
            }
            if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,local_78);
            }
LAB_002b1bfb:
            testing::ScopedTrace::~ScopedTrace(&local_91);
            goto LAB_002b1c05;
          }
          uVar2 = BN_get_word((BIGNUM *)local_50._M_head_impl);
          iVar1 = BN_is_negative(local_50._M_head_impl);
          if ((iVar1 != 0) || (4 < uVar2 - 1)) {
            testing::Message::Message((Message *)&local_70);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_70._M_dataplus._M_p + 0x10),
                       "BN_rand_range_ex generated invalid value: ",0x2a);
            std::ostream::_M_insert<unsigned_long>((ulong)(local_70._M_dataplus._M_p + 0x10));
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x55c,"Failed");
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper(&local_80);
            if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
            }
            goto LAB_002b1bfb;
          }
          *(undefined1 *)((long)&local_40 + uVar2) = 1;
          testing::ScopedTrace::~ScopedTrace(&local_91);
          local_44 = local_44 + 1;
        } while (local_44 < 1000);
        lVar3 = 1;
        do {
          local_80.data_._0_1_ = *(internal *)((long)&local_40 + lVar3);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_80.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_90);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_90._M_head_impl + 0x10),
                       "BN_rand_range failed to generated ",0x22);
            std::ostream::_M_insert<unsigned_long>((ulong)(local_90._M_head_impl + 0x10));
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_70,(internal *)&local_80,(AssertionResult *)"seen[i]","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x568,local_70._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_90._M_head_impl + 8))();
            }
            if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,local_78);
            }
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 6);
        goto LAB_002b1c05;
      }
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(internal *)&local_80,(AssertionResult *)"BN_set_word(six.get(), 6)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x54f,local_70._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_90._M_head_impl + 8))();
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
LAB_002b1c05:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
  return;
}

Assistant:

TEST_F(BNTest, RandRange) {
  bssl::UniquePtr<BIGNUM> bn(BN_new()), six(BN_new());
  ASSERT_TRUE(bn);
  ASSERT_TRUE(six);
  ASSERT_TRUE(BN_set_word(six.get(), 6));

  // Generate 1,000 random numbers and ensure they all stay in range. This check
  // may flakily pass when it should have failed but will not flakily fail.
  bool seen[6] = {false, false, false, false, false};
  for (unsigned i = 0; i < 1000; i++) {
    SCOPED_TRACE(i);
    ASSERT_TRUE(BN_rand_range_ex(bn.get(), 1, six.get()));

    BN_ULONG word = BN_get_word(bn.get());
    if (BN_is_negative(bn.get()) ||  //
        word < 1 ||                  //
        word >= 6) {
      FAIL() << "BN_rand_range_ex generated invalid value: " << word;
    }

    seen[word] = true;
  }

  // Test that all numbers were accounted for. Note this test is probabilistic
  // and may flakily fail when it should have passed. As an upper-bound on the
  // failure probability, we'll never see any one number with probability
  // (4/5)^1000, so the probability of failure is at most 5*(4/5)^1000. This is
  // around 1 in 2^320.
  for (unsigned i = 1; i < 6; i++) {
    EXPECT_TRUE(seen[i]) << "BN_rand_range failed to generated " << i;
  }
}